

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentLowering.cpp
# Opt level: O3

void __thiscall wasm::AlignmentLowering::visitLoad(AlignmentLowering *this,Load *curr)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  Module *this_00;
  address64_t aVar4;
  undefined1 auVar5 [16];
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  address64_t aVar9;
  Id index;
  Memory *pMVar10;
  LocalSet *first;
  Expression *pEVar11;
  Load *pLVar12;
  Unary *this_01;
  Unary *this_02;
  Const *pCVar13;
  Binary *this_03;
  Binary *this_04;
  Block *this_05;
  Block *this_06;
  Type in_R8;
  Builder local_38;
  Builder builder;
  
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  if (uVar2 == 1) {
    Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                ).
                super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                .
                super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
               ,curr->ptr);
    return;
  }
  uVar3 = (curr->align).addr;
  if (uVar3 == 0) {
    return;
  }
  if (uVar3 == curr->bytes) {
    return;
  }
  this_00 = (this->
            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
            ).
            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
            .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>.
            currModule;
  local_38.wasm = this_00;
  if (6 < uVar2) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  if (3 < (int)uVar2 - 2U) {
    handle_unreachable("unhandled unaligned load",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/AlignmentLowering.cpp"
                       ,0x103);
  }
  switch((int)uVar2) {
  case 2:
    this_06 = (Block *)lowerLoadI32(this,curr);
    break;
  case 3:
    if (curr->bytes != 8) {
      (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      bVar1 = curr->signed_;
      pEVar11 = lowerLoadI32(this,curr);
      this_06 = (Block *)Builder::makeUnary(&local_38,bVar1 ^ ExtendUInt32,pEVar11);
      break;
    }
  case 5:
    pMVar10 = Module::getMemory(this_00,(Name)(curr->memory).super_IString.str);
    uVar3 = (pMVar10->indexType).id;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar3;
    index = Builder::addVar((Builder *)
                            (this->
                            super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
                            ).
                            super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .
                            super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
                            .currFunction,(Function *)0x0,(Name)(auVar5 << 0x40),in_R8);
    first = Builder::makeLocalSet(&local_38,index,curr->ptr);
    aVar4 = (curr->offset).addr;
    aVar9 = (curr->align).addr;
    pEVar11 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar11->_id = LocalGetId;
    pEVar11[1]._id = index;
    (pEVar11->type).id = uVar3;
    sVar6 = (curr->memory).super_IString.str._M_len;
    pcVar7 = (curr->memory).super_IString.str._M_str;
    pLVar12 = (Load *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    (pLVar12->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    pLVar12->isAtomic = false;
    pLVar12->bytes = '\x04';
    pLVar12->signed_ = false;
    (pLVar12->offset).addr = aVar4;
    (pLVar12->align).addr = (ulong)(uint)aVar9;
    pLVar12->ptr = pEVar11;
    (pLVar12->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar12->memory).super_IString.str._M_len = sVar6;
    (pLVar12->memory).super_IString.str._M_str = pcVar7;
    pEVar11 = lowerLoadI32(this,pLVar12);
    this_01 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_01->op = ExtendUInt32;
    this_01->value = pEVar11;
    Unary::finalize(this_01);
    aVar4 = (curr->offset).addr;
    uVar8 = (curr->align).addr;
    pEVar11 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar11->_id = LocalGetId;
    pEVar11[1]._id = index;
    (pEVar11->type).id = uVar3;
    sVar6 = (curr->memory).super_IString.str._M_len;
    pcVar7 = (curr->memory).super_IString.str._M_str;
    pLVar12 = (Load *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    (pLVar12->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id = LoadId;
    pLVar12->isAtomic = false;
    pLVar12->bytes = '\x04';
    pLVar12->signed_ = false;
    uVar3 = DAT_00b53020._8_8_;
    (pLVar12->offset).addr = aVar4 + 4;
    (pLVar12->align).addr = uVar8 & uVar3;
    pLVar12->ptr = pEVar11;
    (pLVar12->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    (pLVar12->memory).super_IString.str._M_len = sVar6;
    (pLVar12->memory).super_IString.str._M_str = pcVar7;
    pEVar11 = lowerLoadI32(this,pLVar12);
    this_02 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_02->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_02->op = ExtendUInt32;
    this_02->value = pEVar11;
    Unary::finalize(this_02);
    pCVar13 = Builder::makeConst<long>(&local_38,0x20);
    this_03 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_03->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_03->op = ShlInt64;
    this_03->left = (Expression *)this_02;
    this_03->right = (Expression *)pCVar13;
    Binary::finalize(this_03);
    this_04 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_04->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_04->op = OrInt64;
    this_04->left = (Expression *)this_01;
    this_04->right = (Expression *)this_03;
    Binary::finalize(this_04);
    this_05 = Builder::makeBlock(&local_38,(Expression *)first);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_05->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)this_04);
    Block::finalize(this_05);
    this_06 = this_05;
    if (uVar2 == 5) {
      this_06 = (Block *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
      (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
      (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      *(undefined4 *)&(this_06->name).super_IString.str._M_len = 0x2e;
      (this_06->name).super_IString.str._M_str = (char *)this_05;
      Unary::finalize((Unary *)this_06);
    }
    break;
  case 4:
    (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    pEVar11 = lowerLoadI32(this,curr);
    this_06 = (Block *)MixedArena::allocSpace(&this_00->allocator,0x20,8);
    (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = UnaryId;
    (this_06->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    *(undefined4 *)&(this_06->name).super_IString.str._M_len = 0x2d;
    (this_06->name).super_IString.str._M_str = (char *)pEVar11;
    Unary::finalize((Unary *)this_06);
  }
  Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>_>
              ).
              super_PostWalker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>
              .super_Walker<wasm::AlignmentLowering,_wasm::Visitor<wasm::AlignmentLowering,_void>_>,
             (Expression *)this_06);
  return;
}

Assistant:

void visitLoad(Load* curr) {
    // If unreachable, just remove the load, which removes the unaligned
    // operation in a trivial way.
    if (curr->type == Type::unreachable) {
      replaceCurrent(curr->ptr);
      return;
    }
    if (curr->align == 0 || curr->align == curr->bytes) {
      // Nothing to do: leave the node unchanged. All code lower down assumes
      // the operation is unaligned.
      return;
    }
    Builder builder(*getModule());
    auto type = curr->type.getBasic();
    Expression* replacement;
    switch (type) {
      default:
        WASM_UNREACHABLE("unhandled unaligned load");
      case Type::i32:
        replacement = lowerLoadI32(curr);
        break;
      case Type::f32:
        curr->type = Type::i32;
        replacement = builder.makeUnary(ReinterpretInt32, lowerLoadI32(curr));
        break;
      case Type::i64:
      case Type::f64:
        if (type == Type::i64 && curr->bytes != 8) {
          // A load of <64 bits.
          curr->type = Type::i32;
          replacement = builder.makeUnary(
            curr->signed_ ? ExtendSInt32 : ExtendUInt32, lowerLoadI32(curr));
          break;
        }
        // Load two 32-bit pieces, and combine them.
        auto mem = getModule()->getMemory(curr->memory);
        auto indexType = mem->indexType;
        auto temp = builder.addVar(getFunction(), indexType);
        auto* set = builder.makeLocalSet(temp, curr->ptr);
        Expression* low =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset,
                                        curr->align,
                                        builder.makeLocalGet(temp, indexType),
                                        Type::i32,
                                        curr->memory));
        low = builder.makeUnary(ExtendUInt32, low);
        // Note that the alignment is assumed to be the same here, even though
        // we add an offset of 4. That is because this is an unaligned load, so
        // the alignment is 1, 2, or 4, which means it stays the same after
        // adding 4.
        Expression* high =
          lowerLoadI32(builder.makeLoad(4,
                                        false,
                                        curr->offset + 4,
                                        curr->align,
                                        builder.makeLocalGet(temp, indexType),
                                        Type::i32,
                                        curr->memory));
        high = builder.makeUnary(ExtendUInt32, high);
        high =
          builder.makeBinary(ShlInt64, high, builder.makeConst(int64_t(32)));
        auto* combined = builder.makeBinary(OrInt64, low, high);
        replacement = builder.makeSequence(set, combined);
        // Ensure the proper output type.
        if (type == Type::f64) {
          replacement = builder.makeUnary(ReinterpretInt64, replacement);
        }
        break;
    }
    replaceCurrent(replacement);
  }